

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

bool __thiscall ccs::ParserImpl::parseRuleset(ParserImpl *this,Nested *ast)

{
  bool bVar1;
  
  advance(this);
  bVar1 = advanceIf(this,CONTEXT);
  if (bVar1) {
    parseContext((ParserImpl *)&stack0xffffffffffffffd8);
    std::__shared_ptr<ccs::ast::SelectorBranch,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(ast->selector_).
                super___shared_ptr<ccs::ast::SelectorBranch,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<ccs::ast::SelectorBranch,_(__gnu_cxx::_Lock_policy)2> *)
               &stack0xffffffffffffffd8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0);
  }
  while ((this->cur_).type != EOS) {
    parseRule(this,ast);
  }
  return true;
}

Assistant:

bool parseRuleset(ast::Nested &ast) {
    advance();
    if (advanceIf(Token::CONTEXT)) ast.selector_ = parseContext();
    while (cur_.type != Token::EOS) parseRule(ast);
    return true;
  }